

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O2

bool anon_unknown.dwarf_1647972::isSameStructUnion(Type *left,Type *right)

{
  SymbolKind SVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar2;
  Type *pTVar3;
  Type *pTVar4;
  Scope *pSVar5;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar6;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar7;
  specific_symbol_iterator<slang::ast::FieldSymbol> rit;
  specific_symbol_iterator<slang::ast::FieldSymbol> lit;
  specific_symbol_iterator<slang::ast::FieldSymbol> local_40;
  specific_symbol_iterator<slang::ast::FieldSymbol> local_38;
  
  pTVar3 = slang::ast::Type::getCanonicalType(left);
  pTVar4 = slang::ast::Type::getCanonicalType(right);
  SVar1 = (pTVar3->super_Symbol).kind;
  if ((SVar1 == (pTVar4->super_Symbol).kind) &&
     ((SVar1 == PackedUnionType || (SVar1 == PackedStructType)))) {
    pSVar5 = slang::ast::Symbol::scopeOrNull(&pTVar3->super_Symbol);
    sVar6 = slang::ast::Scope::membersOfType<slang::ast::FieldSymbol>(pSVar5);
    pSVar5 = slang::ast::Symbol::scopeOrNull(&pTVar4->super_Symbol);
    sVar7 = slang::ast::Scope::membersOfType<slang::ast::FieldSymbol>(pSVar5);
    local_40 = sVar7._M_begin.current;
    local_38.current = sVar6._M_begin.current.current;
    while ((local_38.current != sVar6._M_end.current.current &&
           (local_40.current != sVar7._M_end.current.current))) {
      __x._M_len = ((local_38.current)->name)._M_len;
      __x._M_str = ((local_38.current)->name)._M_str;
      __y._M_len = ((local_40.current)->name)._M_len;
      __y._M_str = ((local_40.current)->name)._M_str;
      bVar2 = std::operator==(__x,__y);
      if (!bVar2) goto LAB_003b96ad;
      pTVar3 = slang::ast::DeclaredType::getType((DeclaredType *)(local_38.current + 1));
      pTVar4 = slang::ast::DeclaredType::getType((DeclaredType *)(local_40.current + 1));
      bVar2 = slang::ast::Type::isMatching(pTVar3,pTVar4);
      if (!bVar2) {
        bVar2 = isSameStructUnion(pTVar3,pTVar4);
        if (!bVar2) goto LAB_003b96ad;
      }
      slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::increment(&local_38);
      slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::increment(&local_40);
    }
    bVar2 = local_38.current == sVar6._M_end.current.current &&
            local_40.current == sVar7._M_end.current.current;
  }
  else {
LAB_003b96ad:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool isSameStructUnion(const Type& left, const Type& right) {
    const Type& lt = left.getCanonicalType();
    const Type& rt = right.getCanonicalType();
    if (lt.kind != rt.kind)
        return false;

    if (lt.kind != SymbolKind::PackedStructType && lt.kind != SymbolKind::PackedUnionType)
        return false;

    auto lr = lt.as<Scope>().membersOfType<FieldSymbol>();
    auto rr = rt.as<Scope>().membersOfType<FieldSymbol>();

    auto lit = lr.begin();
    auto rit = rr.begin();
    while (lit != lr.end()) {
        if (rit == rr.end() || lit->name != rit->name)
            return false;

        auto& lft = lit->getType();
        auto& rft = rit->getType();
        if (!lft.isMatching(rft) && !isSameStructUnion(lft, rft))
            return false;

        ++lit;
        ++rit;
    }
    return rit == rr.end();
}